

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatryoshkaDAG.cpp
# Opt level: O0

DomainSet * __thiscall MatryoshkaDAG::extractDomains(MatryoshkaDAG *this,size_t i,float areaCovered)

{
  pointer pDVar1;
  size_t sVar2;
  reference pvVar3;
  reference pvVar4;
  vector<Domain,_std::allocator<Domain>_> *this_00;
  size_type in_RDX;
  MatryoshkaDAG *in_RSI;
  DomainSet *in_RDI;
  float in_XMM0_Da;
  float fVar5;
  float fVar6;
  double dVar7;
  float weight;
  float ratio;
  size_t l;
  size_t k;
  DomainSet *dset;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  vector<Domain,_std::allocator<Domain>_> *in_stack_ffffffffffffff40;
  DomainSet *k_00;
  Domain local_80;
  Domain local_68;
  size_type in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc4;
  uint3 in_stack_ffffffffffffffcc;
  uint uVar8;
  size_type local_30;
  
  uVar8 = (uint)in_stack_ffffffffffffffcc;
  k_00 = in_RDI;
  std::vector<Domain,_std::allocator<Domain>_>::vector
            ((vector<Domain,_std::allocator<Domain>_> *)0x20f5ff);
  local_30 = in_RSI->params->n;
  if ((in_XMM0_Da != -1.0) || (NAN(in_XMM0_Da))) {
    do {
      pvVar3 = std::
               vector<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>,_std::allocator<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>_>_>
               ::operator[](&in_RSI->OPT,local_30);
      pvVar4 = std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>::
               operator[](pvVar3,in_RDX);
      sVar2 = pvVar4->backPointer;
      dVar7 = q(in_RSI,(size_t)k_00,(size_t)in_RDI);
      if (0.0 < dVar7) {
        dVar7 = std::log10((double)(ulong)(uint)(in_XMM0_Da / (float)(local_30 - sVar2)));
        fVar5 = SUB84(dVar7,0);
        this_00 = (vector<Domain,_std::allocator<Domain>_> *)
                  boost::numeric::ublas::
                  symmetric_matrix<double,_boost::numeric::ublas::basic_upper<unsigned_long>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                  ::operator()((symmetric_matrix<double,_boost::numeric::ublas::basic_upper<unsigned_long>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                                *)CONCAT44(uVar8,fVar5),
                               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                               in_stack_ffffffffffffffb8);
        pDVar1 = (this_00->super__Vector_base<Domain,_std::allocator<Domain>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        dVar7 = std::log10((double)CONCAT44((int)((ulong)pDVar1 >> 0x20),(float)(double)pDVar1));
        fVar6 = SUB84(dVar7,0);
        in_stack_ffffffffffffffc4 = fVar6 * fVar5;
        Domain::Domain(&local_80,sVar2 - 1,local_30 - 1,in_stack_ffffffffffffffc4);
        std::vector<Domain,_std::allocator<Domain>_>::push_back
                  (this_00,(value_type *)CONCAT44(fVar6,in_stack_ffffffffffffff38));
      }
      local_30 = sVar2 - 1;
    } while (1 < local_30);
  }
  else {
    do {
      pvVar3 = std::
               vector<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>,_std::allocator<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>_>_>
               ::operator[](&in_RSI->OPT,local_30);
      pvVar4 = std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>::
               operator[](pvVar3,in_RDX);
      sVar2 = pvVar4->backPointer;
      dVar7 = q(in_RSI,(size_t)k_00,(size_t)in_RDI);
      if (0.0 < dVar7) {
        Domain::Domain(&local_68,sVar2 - 1,local_30 - 1);
        std::vector<Domain,_std::allocator<Domain>_>::push_back
                  (in_stack_ffffffffffffff40,
                   (value_type *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      }
      local_30 = sVar2 - 1;
    } while (1 < local_30);
  }
  return k_00;
}

Assistant:

DomainSet MatryoshkaDAG::extractDomains(size_t i, float areaCovered) {
    size_t k,l;
    DomainSet dset;

    float ratio, weight;

    l = params->n;
    if (areaCovered == -1) {    
        do {
            k = OPT[l][i].backPointer;
            if (q(k,l) > 0) {
                dset.push_back(Domain(k-1,l-1)); 
            }
            l = k-1;
        } while(l > 1);
    }
    else {
        do {
            k = OPT[l][i].backPointer;
            if (q(k,l) > 0) {
                ratio = log10(areaCovered/float(l-k));
                weight = log10(float(params->sums(k-1, l-1))) * ratio;
                dset.push_back(Domain(k-1, l-1, weight)); 
            }
            l = k-1;
        } while(l > 1);
    }
    
    return dset;
}